

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function-c.cpp
# Opt level: O1

void __thiscall duckdb::CScalarFunctionInfo::~CScalarFunctionInfo(CScalarFunctionInfo *this)

{
  (this->super_ScalarFunctionInfo)._vptr_ScalarFunctionInfo =
       (_func_int **)&PTR__CScalarFunctionInfo_024aa810;
  if ((this->extra_info != (duckdb_function_info)0x0) &&
     (this->delete_callback != (duckdb_delete_callback_t)0x0)) {
    (*this->delete_callback)(this->extra_info);
  }
  this->extra_info = (duckdb_function_info)0x0;
  this->delete_callback = (duckdb_delete_callback_t)0x0;
  ScalarFunctionInfo::~ScalarFunctionInfo(&this->super_ScalarFunctionInfo);
  return;
}

Assistant:

~CScalarFunctionInfo() override {
		if (extra_info && delete_callback) {
			delete_callback(extra_info);
		}
		extra_info = nullptr;
		delete_callback = nullptr;
	}